

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O0

int __thiscall net::TcpSocket::Accept(TcpSocket *this,char *fromIP,UINT *fromPort)

{
  uint16_t uVar1;
  int iVar2;
  char *__src;
  socklen_t local_3c;
  int clientSock;
  socklen_t len;
  sockaddr_in from;
  UINT *fromPort_local;
  char *fromIP_local;
  TcpSocket *this_local;
  
  from.sin_zero = (uchar  [8])fromPort;
  if (fromIP == (char *)0x0) {
    __assert_fail("fromIP != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                  ,0x2d,"int net::TcpSocket::Accept(char *, UINT &)");
  }
  memset(&clientSock,0,0x10);
  clientSock._0_2_ = 2;
  local_3c = 0x10;
  iVar2 = accept(this->fd_,(sockaddr *)&clientSock,&local_3c);
  if (-1 < iVar2) {
    __src = inet_ntoa((in_addr)len);
    strcpy(fromIP,__src);
    uVar1 = htons(clientSock._2_2_);
    *(uint *)from.sin_zero = (uint)uVar1;
  }
  return iVar2;
}

Assistant:

int TcpSocket::Accept(char* fromIP, UINT& fromPort)
{
    assert(fromIP != NULL);
    sockaddr_in from;
    memset(&from, 0, sizeof(struct sockaddr_in));
    from.sin_family = AF_INET;
    socklen_t len = sizeof(from);
    int clientSock = -1;
    if ((clientSock = accept(fd_, (sockaddr*) &from, &len)) < 0 )
        return clientSock;
    strcpy(fromIP, inet_ntoa(from.sin_addr));
    fromPort = htons(from.sin_port);
    return clientSock;
}